

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::DataScriptModule<(wabt::ScriptModuleType)1>::~DataScriptModule
          (DataScriptModule<(wabt::ScriptModuleType)1> *this)

{
  DataScriptModule<(wabt::ScriptModuleType)1> *this_local;
  
  (this->super_ScriptModuleMixin<(wabt::ScriptModuleType)1>).super_ScriptModule._vptr_ScriptModule =
       (_func_int **)&PTR__DataScriptModule_005ce5d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->data);
  std::__cxx11::string::~string((string *)&this->name);
  ScriptModuleMixin<(wabt::ScriptModuleType)1>::~ScriptModuleMixin
            (&this->super_ScriptModuleMixin<(wabt::ScriptModuleType)1>);
  return;
}

Assistant:

const Location& location() const override { return loc; }